

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::operator()
          (span<int,_18446744073709551615UL> *this,size_type idx)

{
  if (this->size_ <= idx) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1251: Precondition violation."
              );
  }
  return this->data_ + idx;
}

Assistant:

reference operator()( size_type idx ) const
    {
        span_EXPECTS( detail::is_positive( idx ) && idx < size() );

        return *( data() + idx );
    }